

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O3

void __thiscall level_tools::paint_automatic(level_tools *this,xr_surface *surface,uint16_t flags)

{
  char *lname;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  
  lname = (surface->m_gamemtl)._M_dataplus._M_p;
  bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,"collider_presets",lname);
  if (!bVar1) {
    xray_re::msg("no invisible collider preset for game material %s");
    std::__cxx11::string::_M_replace
              ((ulong)&surface->m_texture,0,(char *)(surface->m_texture)._M_string_length,0x1e9beb);
    std::__cxx11::string::_M_replace
              ((ulong)&surface->m_eshader,0,(char *)(surface->m_eshader)._M_string_length,0x1ea926);
    return;
  }
  pcVar3 = xray_re::xr_ini_file::r_string(this->m_ini,"collider_presets",lname);
  cVar4 = *pcVar3;
  if (cVar4 == '\0') {
LAB_001381b3:
    __assert_fail("p != preset",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                  ,0x399,"void level_tools::paint_automatic(xr_surface *, uint16_t) const");
  }
  lVar5 = 0;
  do {
    iVar2 = isalnum((int)cVar4);
    if (((iVar2 == 0) && (cVar4 != '_')) && (cVar4 != '\\')) {
      if (lVar5 == 0) goto LAB_001381b3;
      break;
    }
    cVar4 = pcVar3[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (cVar4 != '\0');
  std::__cxx11::string::_M_replace
            ((ulong)&surface->m_texture,0,(char *)(surface->m_texture)._M_string_length,
             (ulong)pcVar3);
  pcVar3 = pcVar3 + lVar5;
  do {
    do {
      pcVar6 = pcVar3;
      pcVar3 = pcVar6 + 1;
      cVar4 = *pcVar6;
    } while (cVar4 == '\t');
  } while (cVar4 == ' ');
  if (cVar4 == ',') {
    pcVar6 = pcVar6 + 3;
    while( true ) {
      cVar4 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
      if ((cVar4 != '\t') && (cVar4 != ' ')) break;
      pcVar6 = pcVar6 + 1;
    }
    if (cVar4 != '\0') {
      lVar5 = 1;
      do {
        iVar2 = isalnum((int)cVar4);
        if (((iVar2 == 0) && (cVar4 != '_')) && (cVar4 != '\\')) {
          if (lVar5 == 1) {
            return;
          }
          break;
        }
        cVar4 = pcVar6[lVar5 + -1];
        lVar5 = lVar5 + 1;
      } while (cVar4 != '\0');
      std::__cxx11::string::_M_replace
                ((ulong)&surface->m_eshader,0,(char *)(surface->m_eshader)._M_string_length,
                 (ulong)pcVar3);
      for (pcVar6 = pcVar6 + lVar5; (cVar4 = pcVar6[-2], cVar4 == '\t' || (cVar4 == ' '));
          pcVar6 = pcVar6 + 1) {
      }
      if (cVar4 == ',') {
        for (; (cVar4 = *pcVar6, cVar4 == '\t' || (cVar4 == ' ')); pcVar6 = pcVar6 + 1) {
        }
        if (cVar4 != '\0') {
          lVar5 = -1;
          pcVar3 = pcVar6;
          while( true ) {
            pcVar3 = pcVar3 + 1;
            iVar2 = isalnum((int)cVar4);
            if (((iVar2 == 0) && (cVar4 != '_')) && (cVar4 != '\\')) break;
            cVar4 = *pcVar3;
            lVar5 = lVar5 + -1;
            if (cVar4 == '\0') {
LAB_00138210:
              std::__cxx11::string::_M_replace
                        ((ulong)&surface->m_cshader,0,(char *)(surface->m_cshader)._M_string_length,
                         (ulong)pcVar6);
              xray_re::msg("%s -> %s, %s, %s",lname,(surface->m_texture)._M_dataplus._M_p,
                           (surface->m_eshader)._M_dataplus._M_p,
                           (surface->m_cshader)._M_dataplus._M_p);
              return;
            }
          }
          if (lVar5 == -1) {
            return;
          }
          goto LAB_00138210;
        }
      }
    }
  }
  return;
}

Assistant:

void level_tools::paint_automatic(xr_surface* surface, uint16_t flags) const
{
	const char* gamemtl = surface->gamemtl().c_str();
	if (m_ini->line_exist("collider_presets", gamemtl)) {
		const char* preset = m_ini->r_string("collider_presets", gamemtl);

		const char* p = scan_value(preset);
		xr_assert(p != preset);
		surface->texture().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->eshader().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->cshader().assign(preset, p - preset);

		msg("%s -> %s, %s, %s", gamemtl,
				surface->texture().c_str(), surface->eshader().c_str(),
				surface->cshader().c_str());
	} else {
		msg("no invisible collider preset for game material %s", gamemtl);
		surface->texture() = "prop\\prop_fake_kollision";
		surface->eshader() = "def_shaders\\def_vertex";
	}
}